

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O1

void __thiscall GEO::Stopwatch::~Stopwatch(Stopwatch *this)

{
  pointer pcVar1;
  ostream *poVar2;
  double dVar3;
  
  if (this->verbose_ == true) {
    poVar2 = (ostream *)GEO::Logger::out((string *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Elapsed time: ",0xe);
    dVar3 = (double)GEO::SystemStopwatch::elapsed_user_time();
    poVar2 = std::ostream::_M_insert<double>(dVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," s",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  pcVar1 = (this->task_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->task_name_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Stopwatch() {
	    if(verbose_) {
		Logger::out(task_name_)
		    << "Elapsed time: " << W_.elapsed_user_time()
		    << " s" << std::endl;
	    }
        }